

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cc
# Opt level: O0

Node * best_node(Node *first,Node *second,long *target)

{
  long lVar1;
  long lVar2;
  list<const_Operation_*,_std::allocator<const_Operation_*>_> *plVar3;
  size_type sVar4;
  size_type sVar5;
  long sdiff;
  long fdiff;
  long *target_local;
  Node *second_local;
  Node *first_local;
  
  lVar1 = Node::value(first);
  lVar1 = lVar1 - *target;
  if (lVar1 < 1) {
    lVar1 = -lVar1;
  }
  lVar2 = Node::value(second);
  lVar2 = lVar2 - *target;
  if (lVar2 < 1) {
    lVar2 = -lVar2;
  }
  if (lVar2 <= lVar1) {
    lVar1 = Node::value(first);
    lVar2 = Node::value(second);
    if (lVar1 != lVar2) {
      return second;
    }
    plVar3 = Node::steps_abi_cxx11_(first);
    sVar4 = std::__cxx11::list<const_Operation_*,_std::allocator<const_Operation_*>_>::size(plVar3);
    plVar3 = Node::steps_abi_cxx11_(second);
    sVar5 = std::__cxx11::list<const_Operation_*,_std::allocator<const_Operation_*>_>::size(plVar3);
    if (sVar5 <= sVar4) {
      return second;
    }
  }
  return first;
}

Assistant:

Node *best_node(Node *first, Node *second, const long &target)
{
	long fdiff = labs(first->value() - target);
	long sdiff = labs(second->value() - target);

	if (fdiff < sdiff || (first->value() == second->value() &&
			      first->steps().size() < second->steps().size()))
		return first;
	return second;
}